

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# names.cpp
# Opt level: O0

string * miniros::names::clean(string *name)

{
  uint uVar1;
  reference pcVar2;
  long lVar3;
  string *in_RSI;
  string *in_RDI;
  bool bVar4;
  size_t pos;
  string *clean;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this;
  reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_38 [3];
  ulong local_20;
  undefined1 local_11;
  
  local_11 = 0;
  std::__cxx11::string::string((string *)in_RDI,in_RSI);
  local_20 = std::__cxx11::string::find((char *)in_RDI,0x5785fa);
  while (local_20 != 0xffffffffffffffff) {
    std::__cxx11::string::erase((ulong)in_RDI,local_20);
    local_20 = std::__cxx11::string::find((char *)in_RDI,0x5785fa);
  }
  uVar1 = std::__cxx11::string::empty();
  bVar4 = false;
  if ((uVar1 & 1) == 0) {
    this = local_38;
    std::__cxx11::string::rbegin();
    pcVar2 = std::
             reverse_iterator<__gnu_cxx::__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::operator*(this);
    bVar4 = *pcVar2 == '/';
  }
  if (bVar4) {
    lVar3 = std::__cxx11::string::size();
    std::__cxx11::string::erase((ulong)in_RDI,lVar3 - 1);
  }
  return in_RDI;
}

Assistant:

std::string clean(const std::string& name)
{
  std::string clean = name;

  size_t pos = clean.find("//");
  while (pos != std::string::npos)
  {
    clean.erase(pos, 1);
    pos = clean.find("//", pos);
  }

  if (!name.empty() && *clean.rbegin() == '/')
  {
    clean.erase(clean.size() - 1, 1);
  }

  return clean;
}